

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O2

void ELFIO::dump::section_data(ostream *out,section *sec)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar7;
  Elf_Xword i;
  ulong uVar8;
  string local_50 [32];
  
  uVar1 = *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  (*sec->_vptr_section[3])(local_50);
  poVar6 = std::operator<<(out,local_50);
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::string::~string(local_50);
  iVar4 = (*sec->_vptr_section[0x18])(sec);
  if (CONCAT44(extraout_var,iVar4) != 0) {
    uVar8 = 0;
    while( true ) {
      iVar5 = (*sec->_vptr_section[0x13])(sec);
      uVar7 = CONCAT44(extraout_var_00,iVar5);
      if (0x3f < CONCAT44(extraout_var_00,iVar5)) {
        uVar7 = 0x40;
      }
      if (uVar7 <= uVar8) break;
      if ((uVar8 & 0xf) == 0) {
        poVar6 = std::operator<<(out,"[");
        poVar6 = std::operator<<(poVar6,"0x");
        *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 8;
        poVar6 = std::operator<<(poVar6,0x30);
        lVar2 = *(long *)poVar6;
        lVar3 = *(long *)(lVar2 + -0x18);
        *(uint *)(poVar6 + lVar3 + 0x18) = *(uint *)(poVar6 + lVar3 + 0x18) & 0xffffffb5 | 8;
        lVar2 = *(long *)(lVar2 + -0x18);
        *(uint *)(poVar6 + lVar2 + 0x18) = *(uint *)(poVar6 + lVar2 + 0x18) & 0xffffff4f | 0x80;
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::operator<<(poVar6,"]");
      }
      poVar6 = std::operator<<(out," ");
      poVar6 = std::operator<<(poVar6,"0x");
      *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 2;
      poVar6 = std::operator<<(poVar6,0x30);
      lVar2 = *(long *)poVar6;
      lVar3 = *(long *)(lVar2 + -0x18);
      *(uint *)(poVar6 + lVar3 + 0x18) = *(uint *)(poVar6 + lVar3 + 0x18) & 0xffffffb5 | 8;
      lVar2 = *(long *)(lVar2 + -0x18);
      *(uint *)(poVar6 + lVar2 + 0x18) = *(uint *)(poVar6 + lVar2 + 0x18) & 0xffffff4f | 0x80;
      std::ostream::operator<<(poVar6,(uint)*(byte *)(CONCAT44(extraout_var,iVar4) + uVar8));
      if (((uint)uVar8 & 0xf) == 0xf) {
        std::endl<char,std::char_traits<char>>(out);
      }
      uVar8 = uVar8 + 1;
    }
    if ((uVar8 & 0xf) != 0) {
      std::endl<char,std::char_traits<char>>(out);
    }
    *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
  }
  return;
}

Assistant:

static void section_data( std::ostream& out, const section* sec )
    {
        std::ios_base::fmtflags original_flags = out.flags();

        out << sec->get_name() << std::endl;
        const char* pdata = sec->get_data();
        if ( pdata ) {
            ELFIO::Elf_Xword i;
            for ( i = 0; i < std::min( sec->get_size(), MAX_DATA_ENTRIES );
                  ++i ) {
                if ( i % 16 == 0 ) {
                    out << "[" << DUMP_HEX0x_FORMAT( 8 ) << i << "]";
                }

                out << " " << DUMP_HEX0x_FORMAT( 2 )
                    << ( pdata[i] & 0x000000FF );

                if ( i % 16 == 15 ) {
                    out << std::endl;
                }
            }
            if ( i % 16 != 0 ) {
                out << std::endl;
            }

            out.flags( original_flags );
        }

        return;
    }